

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::add_sample
          (TypedTimeSamples<tinyusdz::value::matrix4d> *this,double t,matrix4d *v)

{
  undefined1 local_b0 [8];
  Sample s;
  matrix4d *v_local;
  double t_local;
  TypedTimeSamples<tinyusdz::value::matrix4d> *this_local;
  
  s._136_8_ = v;
  Sample::Sample((Sample *)local_b0);
  local_b0 = (undefined1  [8])t;
  memcpy(&s,(void *)s._136_8_,0x80);
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::matrix4d>::Sample>>
              *)this,(Sample *)local_b0);
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }